

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composable.cpp
# Opt level: O1

int main(void)

{
  Result RVar1;
  int iVar2;
  int *piVar3;
  Coro coroutine;
  timespec local_70;
  SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag> local_60;
  
  local_60.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>
  .super_PrintStart<SCoro::Impl::Nothing>.input = (PrintStart<SCoro::Impl::Nothing>)"composable";
  local_60.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
  .nested_state.super_type.
  super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>_>
  .
  super_StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>
  .super_RecordTime<SCoro::Impl::Nothing>.start_time.__d.__r =
       (WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>_>
        )(StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>
          )0x0;
  local_60.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
  .nested_state.super_EboIndex<2UL>.index = 0;
  local_60.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
  .nested_state.super_EboIndex<2UL>.index = (EboIndex<2UL>)0;
  local_60.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .nested_state.super_type.
  super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>_>
  .
  super_StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>
  .super_RecordTime<SCoro::Impl::Nothing>.start_time.__d.__r =
       (WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>_>
        )(StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>
          )0x0;
  local_60.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .nested_state.super_EboIndex<2UL>.index = 0;
  local_60.super_EboIndex<5UL>.index = 0;
  do {
    while ((RVar1 = (*SCoro::Impl::
                      GetImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>_>
                      ::lut[local_60.super_EboIndex<5UL>.index])(&local_60), RVar1.value != Yield &&
           ((RVar1.value != Next ||
            (local_60.super_EboIndex<5UL>.index = local_60.super_EboIndex<5UL>.index + 1,
            4 < local_60.super_EboIndex<5UL>.index))))) {
      local_60.super_type.
      super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
      .
      super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
      .
      super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
      .
      super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>
      .super_PrintStart<SCoro::Impl::Nothing>.input = (PrintStart<SCoro::Impl::Nothing>)"composable"
      ;
      local_60.super_type.
      super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
      .
      super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .nested_state.super_EboIndex<2UL>.index = 0;
      local_60.super_EboIndex<5UL>.index = 0;
      local_60.super_type.
      super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
      .
      super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
      .
      super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
      .nested_state.super_EboIndex<2UL>.index = (EboIndex<2UL>)0;
      local_60.super_type.
      super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
      .
      super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .nested_state.super_type.
      super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>_>
      .
      super_StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>
      .super_RecordTime<SCoro::Impl::Nothing>.start_time.__d.__r =
           (WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>_>
            )(StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>
              )0x0;
      local_60.super_type.
      super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
      .
      super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
      .
      super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
      .
      super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
      .nested_state.super_type.
      super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>_>
      .
      super_StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>
      .super_RecordTime<SCoro::Impl::Nothing>.start_time.__d.__r =
           (WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>_>
            )(StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>
              )0x0;
      local_60.super_type.
      super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
      .
      super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
      .
      super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
      .
      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
      .
      super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
      .nested_state.super_EboIndex<2UL>.index = 0;
      putchar(10);
    }
    putchar(0x2d);
    local_70.tv_sec = 0;
    local_70.tv_nsec = 10000000;
    do {
      iVar2 = nanosleep(&local_70,&local_70);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  } while( true );
}

Assistant:

int main()
{
    Coro coroutine{"composable"};
    while (true)
    {
        while ( coroutine.Poll() != SCoro::Result::End )
        {
            std::putchar('-');
            std::this_thread::sleep_for(std::chrono::milliseconds{10});
        }
        // This resets coroutine state.
        coroutine.Reset("composable");
        std::printf("\n");
    }
    return 0;
}